

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O3

size_t x11_send(Channel *chan,_Bool is_stderr,void *vdata,size_t len)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  ChannelVtable *__s1;
  long *blk;
  _Bool _Var4;
  ushort uVar5;
  int iVar6;
  ChannelVtable *pCVar7;
  void *pvVar8;
  size_t sVar9;
  undefined8 *puVar10;
  int *piVar11;
  long lVar12;
  time_t tVar13;
  uint *puVar14;
  uint *puVar15;
  SockAddr *addr;
  Conf *conf;
  byte *pbVar16;
  ushort uVar17;
  char *pcVar18;
  uint uVar19;
  undefined1 *puVar20;
  int socketdatalen;
  X11Connection *local_c8;
  ulong local_c0;
  unsigned_long peer_ip;
  int greeting_len;
  char new_peer_addr [32];
  undefined4 local_80 [2];
  undefined8 local_78;
  int local_70;
  undefined8 local_58 [5];
  
  if (chan->vt != &X11Connection_channelvt) {
    __assert_fail("chan->vt == &X11Connection_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                  0x1ce,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
  }
  puVar20 = (undefined1 *)vdata;
  if (len != 0) {
    do {
      iVar2 = *(int *)&chan[-4].vt;
      vdata = puVar20;
      if (0xb < (long)iVar2) goto LAB_0012fec3;
      vdata = puVar20 + 1;
      uVar1 = *puVar20;
      *(int *)&chan[-4].vt = iVar2 + 1;
      *(undefined1 *)((long)&chan[-7].vt + (long)iVar2) = uVar1;
      len = len - 1;
      puVar20 = (undefined1 *)vdata;
    } while (len != 0);
  }
  len = 0;
  if (*(int *)&chan[-4].vt < 0xc) {
    return 0;
  }
LAB_0012fec3:
  if (chan[-5].vt == (ChannelVtable *)0x0) {
    if (*(char *)&chan[-7].vt == 'B') {
      uVar17 = *(ushort *)((long)&chan[-7].vt + 6);
      uVar17 = uVar17 << 8 | uVar17 >> 8;
      uVar5 = (ushort)chan[-7].initial_fixed_window_size;
      uVar5 = uVar5 << 8 | uVar5 >> 8;
    }
    else {
      uVar17 = *(ushort *)((long)&chan[-7].vt + 6);
      uVar5 = (ushort)chan[-7].initial_fixed_window_size;
    }
    *(uint *)((long)&chan[-4].vt + 4) = (uint)uVar17;
    *(uint *)&chan[-4].field_0xc = (uint)uVar5;
    uVar19 = uVar17 + 3 & 0xfffffffc;
    chan[-4].initial_fixed_window_size = uVar19;
    *(uint *)&chan[-3].vt = uVar5 + 3 & 0xfffffffc;
    pCVar7 = (ChannelVtable *)safemalloc((ulong)(uVar19 + 1),1,0);
    chan[-5].vt = pCVar7;
    pvVar8 = safemalloc((long)*(int *)&chan[-3].vt,1,0);
    *(void **)&chan[-5].initial_fixed_window_size = pvVar8;
  }
  for (; len != 0; len = len - 1) {
    iVar2 = *(int *)&chan[-4].vt;
    if ((int)(chan[-4].initial_fixed_window_size + 0xc) <= iVar2) goto LAB_0012ffc9;
    uVar1 = *vdata;
    *(int *)&chan[-4].vt = iVar2 + 1;
    *(undefined1 *)((long)chan[-5].vt + (long)iVar2 + -0xc) = uVar1;
    vdata = (undefined1 *)((long)vdata + 1);
  }
  goto LAB_0012ff6d;
  while( true ) {
    puVar20 = (undefined1 *)((long)vdata + 1);
    uVar1 = *vdata;
    lVar12 = *(long *)&chan[-5].initial_fixed_window_size;
    *(int *)&chan[-4].vt = iVar2 + 1;
    *(undefined1 *)(lVar12 + (int)((iVar2 - chan[-4].initial_fixed_window_size) + -0xc)) = uVar1;
    len = len - 1;
    vdata = puVar20;
    if (len == 0) break;
LAB_0012ffc9:
    iVar2 = *(int *)&chan[-4].vt;
    if ((int)(*(int *)&chan[-3].vt + chan[-4].initial_fixed_window_size + 0xc) <= iVar2)
    goto LAB_0012ff6f;
  }
LAB_0012ff6d:
  len = 0;
LAB_0012ff6f:
  if (*(int *)&chan[-4].vt < (int)(chan[-4].initial_fixed_window_size + *(int *)&chan[-3].vt + 0xc))
  {
    return 0;
  }
  if (*(char *)((long)&chan[-3].vt + 4) == '\0') {
    if (*(char *)&chan[-7].vt == 'B') {
      uVar17 = *(ushort *)((long)&chan[-7].vt + 2);
      uVar17 = uVar17 << 8 | uVar17 >> 8;
      uVar5 = *(ushort *)((long)&chan[-7].vt + 4);
      uVar5 = uVar5 << 8 | uVar5 >> 8;
    }
    else {
      uVar17 = *(ushort *)((long)&chan[-7].vt + 2);
      uVar5 = *(ushort *)((long)&chan[-7].vt + 4);
    }
    if (chan[-1].vt != (ChannelVtable *)0x0) {
      __assert_fail("!xconn->s",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                    ,0x20a,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
    }
    *(undefined1 *)((long)&(chan[-5].vt)->free + (long)*(int *)((long)&chan[-4].vt + 4)) = 0;
    peer_ip = 0;
    _Var4 = x11_parse_ip(*(char **)&chan[-3].initial_fixed_window_size,&peer_ip);
    uVar19 = 0xffffffff;
    if (_Var4) {
      uVar19 = *(uint *)&chan[-2].vt;
    }
    local_c8 = (X11Connection *)(chan + -7);
    local_c0 = peer_ip;
    pCVar7 = chan[-6].vt;
    __s1 = chan[-5].vt;
    blk = *(long **)&chan[-5].initial_fixed_window_size;
    iVar2 = *(int *)&chan[-4].field_0xc;
    iVar6 = strcmp((char *)__s1,"MIT-MAGIC-COOKIE-1");
    if (iVar6 == 0) {
      puVar10 = &local_78;
      local_80[0] = 1;
      local_70 = iVar2;
    }
    else {
      iVar6 = strcmp((char *)__s1,"XDM-AUTHORIZATION-1");
      if (iVar6 != 0) {
        pcVar18 = "Unsupported authorisation protocol";
        goto LAB_001301cd;
      }
      puVar10 = local_58;
      local_80[0] = 2;
    }
    *puVar10 = blk;
    piVar11 = (int *)find234((tree234 *)pCVar7,local_80,(cmpfn234)0x0);
    if (piVar11 == (int *)0x0) {
      pcVar18 = "Authorisation not recognised";
      goto LAB_001301cd;
    }
    if (*piVar11 == 2) {
      if (iVar2 != 0x18) {
        pcVar18 = "XDM-AUTHORIZATION-1 data was wrong length";
LAB_001301cd:
        x11_send_init_error(local_c8,pcVar18);
        return 0;
      }
      if (uVar19 == 0xffffffff) {
        pcVar18 = "cannot do XDM-AUTHORIZATION-1 without remote address data";
        goto LAB_001301cd;
      }
      des_decrypt_xdmauth((void *)(*(long *)(piVar11 + 2) + 9),blk,0x18);
      pcVar18 = "XDM-AUTHORIZATION-1 data failed check";
      if (((**(long **)(piVar11 + 2) != *blk) ||
          (uVar3 = *(uint *)(blk + 1),
          (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) !=
          local_c0)) ||
         ((ushort)(*(ushort *)((long)blk + 0xc) << 8 | *(ushort *)((long)blk + 0xc) >> 8) != uVar19)
         ) goto LAB_001301cd;
      uVar19 = *(uint *)((long)blk + 0xe);
      uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
      lVar12 = -6;
      do {
        if (*(char *)((long)blk + lVar12 + 0x18) != '\0') goto LAB_001301cd;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
      tVar13 = time((time_t *)0x0);
      if (((ulong)uVar19 - tVar13) - 0x4b1 < 0xfffffffffffff69f) {
        pcVar18 = "XDM-AUTHORIZATION-1 time stamp was too far out";
        goto LAB_001301cd;
      }
      puVar14 = (uint *)safemalloc(1,0xc,0);
      *puVar14 = uVar19;
      *(undefined2 *)(puVar14 + 2) = *(undefined2 *)((long)blk + 0xc);
      puVar14[1] = *(uint *)(blk + 1);
      if (*(tree234 **)(piVar11 + 0xc) == (tree234 *)0x0) {
        __assert_fail("auth->xdmseen != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                      ,0xf0,
                      "const char *x11_verify(unsigned long, int, tree234 *, char *, unsigned char *, int, struct X11FakeAuth **)"
                     );
      }
      puVar15 = (uint *)add234(*(tree234 **)(piVar11 + 0xc),puVar14);
      if (puVar15 != puVar14) {
        safefree(puVar14);
        pcVar18 = "XDM-AUTHORIZATION-1 data replayed";
        goto LAB_001301cd;
      }
      while( true ) {
        puVar14 = (uint *)index234(*(tree234 **)(piVar11 + 0xc),0);
        if (puVar14 == (uint *)0x0) {
          __assert_fail("seen != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                        ,0xf9,
                        "const char *x11_verify(unsigned long, int, tree234 *, char *, unsigned char *, int, struct X11FakeAuth **)"
                       );
        }
        if ((ulong)uVar19 - (ulong)*puVar14 < 0x4b1) break;
        pvVar8 = delpos234(*(tree234 **)(piVar11 + 0xc),0);
        safefree(pvVar8);
      }
    }
    if (*(long *)(piVar11 + 0x10) != 0) {
      (**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x30))
                (*(long **)&chan[-2].initial_fixed_window_size,*(long *)(piVar11 + 0x10),
                 *(undefined8 *)(piVar11 + 0x12),*(undefined8 *)&chan[-3].initial_fixed_window_size,
                 *(undefined4 *)&chan[-2].vt,*(undefined1 *)&chan[-7].vt,uVar17,uVar5,vdata,len);
      return 0;
    }
    chan->initial_fixed_window_size = 0;
    (**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x28))();
    lVar12 = *(long *)(piVar11 + 0xe);
    *(long *)&chan[-6].initial_fixed_window_size = lVar12;
    addr = sk_addr_dup(*(SockAddr **)(lVar12 + 0x20));
    pcVar18 = *(char **)(*(long *)&chan[-6].initial_fixed_window_size + 0x30);
    iVar2 = *(int *)(*(long *)&chan[-6].initial_fixed_window_size + 0x28);
    conf = (Conf *)(**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x20))();
    pCVar7 = (ChannelVtable *)
             new_connection(addr,pcVar18,iVar2,false,true,false,false,
                            (Plug *)&chan[-1].initial_fixed_window_size,conf,(Interactor *)0x0);
    chan[-1].vt = pCVar7;
    pcVar18 = (*((SocketVtable *)pCVar7->free)->socket_error)((Socket *)pCVar7);
    if (pcVar18 != (char *)0x0) {
      pcVar18 = dupprintf("unable to connect to forwarded X server: %s",pcVar18);
      x11_send_init_error(local_c8,pcVar18);
      safefree(pcVar18);
      return 0;
    }
    socketdatalen = 0;
    pbVar16 = (byte *)sk_getxdmdata((Socket *)chan[-1].vt,&socketdatalen);
    if ((pbVar16 == (byte *)0x0) || (socketdatalen != 6)) {
      builtin_strncpy(new_peer_addr,"0.0.0.0",8);
      uVar19 = 0;
    }
    else {
      sprintf(new_peer_addr,"%d.%d.%d.%d",(ulong)*pbVar16,(ulong)pbVar16[1],(ulong)pbVar16[2],
              (ulong)pbVar16[3]);
      uVar19 = (uint)(ushort)(*(ushort *)(pbVar16 + 4) << 8 | *(ushort *)(pbVar16 + 4) >> 8);
    }
    lVar12 = *(long *)&chan[-6].initial_fixed_window_size;
    pvVar8 = x11_make_greeting((uint)*(byte *)&chan[-7].vt,(uint)uVar17,(uint)uVar5,
                               *(int *)(lVar12 + 0x38),*(void **)(lVar12 + 0x40),
                               *(int *)(lVar12 + 0x48),new_peer_addr,uVar19,&greeting_len);
    (**(code **)((chan[-1].vt)->free + 0x10))(chan[-1].vt,pvVar8,(long)greeting_len);
    smemclr(pvVar8,(long)greeting_len);
    safefree(pvVar8);
    *(undefined1 *)((long)&chan[-3].vt + 4) = 1;
  }
  sVar9 = (**(code **)((chan[-1].vt)->free + 0x10))(chan[-1].vt,vdata,len);
  return sVar9;
}

Assistant:

static size_t x11_send(
    Channel *chan, bool is_stderr, const void *vdata, size_t len)
{
    assert(chan->vt == &X11Connection_channelvt);
    X11Connection *xconn = container_of(chan, X11Connection, chan);
    const char *data = (const char *)vdata;

    /*
     * Read the first packet.
     */
    while (len > 0 && xconn->data_read < 12)
        xconn->firstpkt[xconn->data_read++] = (unsigned char) (len--, *data++);
    if (xconn->data_read < 12)
        return 0;

    /*
     * If we have not allocated the auth_protocol and auth_data
     * strings, do so now.
     */
    if (!xconn->auth_protocol) {
        char endian = xconn->firstpkt[0];
        xconn->auth_plen = GET_16BIT_X11(endian, xconn->firstpkt + 6);
        xconn->auth_dlen = GET_16BIT_X11(endian, xconn->firstpkt + 8);
        xconn->auth_psize = (xconn->auth_plen + 3) & ~3;
        xconn->auth_dsize = (xconn->auth_dlen + 3) & ~3;
        /* Leave room for a terminating zero, to make our lives easier. */
        xconn->auth_protocol = snewn(xconn->auth_psize + 1, char);
        xconn->auth_data = snewn(xconn->auth_dsize, unsigned char);
    }

    /*
     * Read the auth_protocol and auth_data strings.
     */
    while (len > 0 &&
           xconn->data_read < 12 + xconn->auth_psize)
        xconn->auth_protocol[xconn->data_read++ - 12] = (len--, *data++);
    while (len > 0 &&
           xconn->data_read < 12 + xconn->auth_psize + xconn->auth_dsize)
        xconn->auth_data[xconn->data_read++ - 12 -
                      xconn->auth_psize] = (unsigned char) (len--, *data++);
    if (xconn->data_read < 12 + xconn->auth_psize + xconn->auth_dsize)
        return 0;

    /*
     * If we haven't verified the authorisation, do so now.
     */
    if (!xconn->verified) {
        const char *err;
        struct X11FakeAuth *auth_matched = NULL;
        unsigned long peer_ip;
        int peer_port;
        int protomajor, protominor;
        void *greeting;
        int greeting_len;
        unsigned char *socketdata;
        int socketdatalen;
        char new_peer_addr[32];
        int new_peer_port;
        char endian = xconn->firstpkt[0];

        protomajor = GET_16BIT_X11(endian, xconn->firstpkt + 2);
        protominor = GET_16BIT_X11(endian, xconn->firstpkt + 4);

        assert(!xconn->s);

        xconn->auth_protocol[xconn->auth_plen] = '\0';  /* ASCIZ */

        peer_ip = 0;                   /* placate optimiser */
        if (x11_parse_ip(xconn->peer_addr, &peer_ip))
            peer_port = xconn->peer_port;
        else
            peer_port = -1; /* signal no peer address data available */

        err = x11_verify(peer_ip, peer_port,
                         xconn->authtree, xconn->auth_protocol,
                         xconn->auth_data, xconn->auth_dlen, &auth_matched);
        if (err) {
            x11_send_init_error(xconn, err);
            return 0;
        }
        assert(auth_matched);

        /*
         * If this auth points to a connection-sharing downstream
         * rather than an X display we know how to connect to
         * directly, pass it off to the sharing module now. (This will
         * have the side effect of freeing xconn.)
         */
        if (auth_matched->share_cs) {
            sshfwd_x11_sharing_handover(xconn->c, auth_matched->share_cs,
                                        auth_matched->share_chan,
                                        xconn->peer_addr, xconn->peer_port,
                                        xconn->firstpkt[0],
                                        protomajor, protominor, data, len);
            return 0;
        }

        /*
         * Now we know we're going to accept the connection, and what
         * X display to connect to. Actually connect to it.
         */
        xconn->chan.initial_fixed_window_size = 0;
        sshfwd_window_override_removed(xconn->c);
        xconn->disp = auth_matched->disp;
        xconn->s = new_connection(sk_addr_dup(xconn->disp->addr),
                                  xconn->disp->realhost, xconn->disp->port,
                                  false, true, false, false, &xconn->plug,
                                  sshfwd_get_conf(xconn->c), NULL);
        if ((err = sk_socket_error(xconn->s)) != NULL) {
            char *err_message = dupprintf("unable to connect to"
                                          " forwarded X server: %s", err);
            x11_send_init_error(xconn, err_message);
            sfree(err_message);
            return 0;
        }

        /*
         * Write a new connection header containing our replacement
         * auth data.
         */
        socketdatalen = 0;             /* placate compiler warning */
        socketdata = sk_getxdmdata(xconn->s, &socketdatalen);
        if (socketdata && socketdatalen==6) {
            sprintf(new_peer_addr, "%d.%d.%d.%d", socketdata[0],
                    socketdata[1], socketdata[2], socketdata[3]);
            new_peer_port = GET_16BIT_MSB_FIRST(socketdata + 4);
        } else {
            strcpy(new_peer_addr, "0.0.0.0");
            new_peer_port = 0;
        }

        greeting = x11_make_greeting(xconn->firstpkt[0],
                                     protomajor, protominor,
                                     xconn->disp->localauthproto,
                                     xconn->disp->localauthdata,
                                     xconn->disp->localauthdatalen,
                                     new_peer_addr, new_peer_port,
                                     &greeting_len);

        sk_write(xconn->s, greeting, greeting_len);

        smemclr(greeting, greeting_len);
        sfree(greeting);

        /*
         * Now we're done.
         */
        xconn->verified = true;
    }

    /*
     * After initialisation, just copy data simply.
     */

    return sk_write(xconn->s, data, len);
}